

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderConstExprTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderConstExprBuiltinTests::init
          (ShaderConstExprBuiltinTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testContext;
  int extraout_EAX;
  RenderContext *renderContext;
  ContextInfo *contextInfo;
  TestNode *node;
  size_type sVar1;
  const_reference ppTVar2;
  int local_1658;
  int i;
  TestCaseGroup *group;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  TestParams cases_7 [3];
  undefined1 local_15a8 [8];
  TestParams cases_6 [27];
  undefined1 local_1168 [8];
  TestParams cases_5 [27];
  undefined1 local_d28 [8];
  TestParams cases_4 [25];
  undefined1 local_938 [8];
  TestParams cases_3 [5];
  undefined1 local_868 [8];
  TestParams cases_2 [31];
  undefined1 local_388 [8];
  TestParams cases_1 [7];
  undefined1 local_268 [8];
  TestParams cases [15];
  ShaderConstExprBuiltinTests *this_local;
  
  local_268 = (undefined1  [8])0x2b77d08;
  cases[0].name = "radians(${T} (90.0))";
  cases[0].expression._0_4_ = 1;
  cases[0].expression._4_4_ = 1;
  cases[0].inType = TYPE_FLOAT_VEC4;
  cases[0].minComponents = 1;
  cases[0xe]._32_8_ = this;
  cases[0].maxComponents = (int)deFloatRadians(90.0);
  cases[0]._32_8_ = anon_var_dwarf_d99a71;
  cases[1].name = "degrees(${T} (2.0))";
  cases[1].expression._0_4_ = 1;
  cases[1].expression._4_4_ = 1;
  cases[1].inType = TYPE_FLOAT_VEC4;
  cases[1].minComponents = 1;
  cases[1].maxComponents = (int)deFloatDegrees(2.0);
  cases[1]._32_8_ = (long)"asin" + 1;
  cases[2].name = "sin(${T} (3.0))";
  cases[2].expression._0_4_ = 1;
  cases[2].expression._4_4_ = 1;
  cases[2].inType = TYPE_FLOAT_VEC4;
  cases[2].minComponents = 1;
  cases[2].maxComponents = (int)::deFloatSin(3.0);
  cases[2]._32_8_ = (long)"acos" + 1;
  cases[3].name = "cos(${T} (3.2))";
  cases[3].expression._0_4_ = 1;
  cases[3].expression._4_4_ = 1;
  cases[3].inType = TYPE_FLOAT_VEC4;
  cases[3].minComponents = 1;
  cases[3].maxComponents = (int)::deFloatCos(3.2);
  cases[3]._32_8_ = (long)"atan" + 1;
  cases[4].name = "tan(${T} (1.5))";
  cases[4].expression._0_4_ = 1;
  cases[4].expression._4_4_ = 1;
  cases[4].inType = TYPE_FLOAT_VEC4;
  cases[4].minComponents = 1;
  cases[4].maxComponents = (int)deFloatTan(1.5);
  cases[4]._32_8_ = anon_var_dwarf_d99ae5;
  cases[5].name = "asin(${T} (0.0))";
  cases[5].expression._0_4_ = 1;
  cases[5].expression._4_4_ = 1;
  cases[5].inType = TYPE_FLOAT_VEC4;
  cases[5].minComponents = 1;
  cases[5].maxComponents = (int)deFloatAsin(0.0);
  cases[5]._32_8_ = anon_var_dwarf_d99b11;
  cases[6].name = "acos(${T} (1.0))";
  cases[6].expression._0_4_ = 1;
  cases[6].expression._4_4_ = 1;
  cases[6].inType = TYPE_FLOAT_VEC4;
  cases[6].minComponents = 1;
  cases[6].maxComponents = (int)deFloatAcos(1.0);
  cases[6]._32_8_ = anon_var_dwarf_d99b25;
  cases[7].name = "atan(${T} (-1.0), ${T} (-1.0))";
  cases[7].expression._0_4_ = 1;
  cases[7].expression._4_4_ = 1;
  cases[7].inType = TYPE_FLOAT_VEC4;
  cases[7].minComponents = 1;
  cases[7].maxComponents = (int)deFloatAtan2(-1.0,-1.0);
  cases[7]._32_8_ = anon_var_dwarf_d99b51;
  cases[8].name = "atan(${T} (2.0))";
  cases[8].expression._0_4_ = 1;
  cases[8].expression._4_4_ = 1;
  cases[8].inType = TYPE_FLOAT_VEC4;
  cases[8].minComponents = 1;
  cases[8].maxComponents = (int)deFloatAtanOver(2.0);
  cases[8]._32_8_ = (long)"asinh" + 1;
  cases[9].name = "sinh(${T} (1.5))";
  cases[9].expression._0_4_ = 1;
  cases[9].expression._4_4_ = 1;
  cases[9].inType = TYPE_FLOAT_VEC4;
  cases[9].minComponents = 1;
  cases[9].maxComponents = (int)deFloatSinh(1.5);
  cases[9]._32_8_ = (long)"acosh" + 1;
  cases[10].name = "cosh(${T} (1.5))";
  cases[10].expression._0_4_ = 1;
  cases[10].expression._4_4_ = 1;
  cases[10].inType = TYPE_FLOAT_VEC4;
  cases[10].minComponents = 1;
  cases[10].maxComponents = (int)deFloatCosh(1.5);
  cases[10]._32_8_ = (long)"atanh" + 1;
  cases[0xb].name = "tanh(${T} (1.5))";
  cases[0xb].expression._0_4_ = 1;
  cases[0xb].expression._4_4_ = 1;
  cases[0xb].inType = TYPE_FLOAT_VEC4;
  cases[0xb].minComponents = 1;
  cases[0xb].maxComponents = (int)deFloatTanh(1.5);
  cases[0xb]._32_8_ = anon_var_dwarf_11e98ba;
  cases[0xc].name = "asinh(${T} (2.0))";
  cases[0xc].expression._0_4_ = 1;
  cases[0xc].expression._4_4_ = 1;
  cases[0xc].inType = TYPE_FLOAT_VEC4;
  cases[0xc].minComponents = 1;
  cases[0xc].maxComponents = (int)deFloatAsinh(2.0);
  cases[0xc]._32_8_ = anon_var_dwarf_11e98e6;
  cases[0xd].name = "acosh(${T} (2.0))";
  cases[0xd].expression._0_4_ = 1;
  cases[0xd].expression._4_4_ = 1;
  cases[0xd].inType = TYPE_FLOAT_VEC4;
  cases[0xd].minComponents = 1;
  cases[0xd].maxComponents = (int)deFloatAcosh(2.0);
  cases[0xd]._32_8_ = anon_var_dwarf_11e98fa;
  cases[0xe].name = "atanh(${T} (0.8))";
  cases[0xe].expression._0_4_ = 1;
  cases[0xe].expression._4_4_ = 1;
  cases[0xe].inType = TYPE_FLOAT_VEC4;
  cases[0xe].minComponents = 1;
  cases[0xe].maxComponents = (int)deFloatAtanh(0.8);
  addChildGroup(this,"angle_and_trigonometry","Angles and Trigonometry",(TestParams *)local_268,0xf)
  ;
  local_388 = (undefined1  [8])0x2b77de9;
  cases_1[0].name = "pow(${T} (1.7), ${T} (3.5))";
  cases_1[0].expression._0_4_ = 1;
  cases_1[0].expression._4_4_ = 1;
  cases_1[0].inType = TYPE_FLOAT_VEC4;
  cases_1[0].minComponents = 1;
  cases_1[0].maxComponents = (int)deFloatPow(1.7,3.5);
  cases_1[0]._32_8_ = (long)"ldexp_invalid_exp" + 0xe;
  cases_1[1].name = "exp(${T} (4.2))";
  cases_1[1].expression._0_4_ = 1;
  cases_1[1].expression._4_4_ = 1;
  cases_1[1].inType = TYPE_FLOAT_VEC4;
  cases_1[1].minComponents = 1;
  cases_1[1].maxComponents = (int)deFloatExp(4.2);
  cases_1[1]._32_8_ = (long)"Reporting of standard API errors via log" + 0x25;
  cases_1[2].name = "log(${T} (42.12))";
  cases_1[2].expression._0_4_ = 1;
  cases_1[2].expression._4_4_ = 1;
  cases_1[2].inType = TYPE_FLOAT_VEC4;
  cases_1[2].minComponents = 1;
  cases_1[2].maxComponents = (int)deFloatLog(42.12);
  cases_1[2]._32_8_ = anon_var_dwarf_d99bd9;
  cases_1[3].name = "exp2(${T} (6.7))";
  cases_1[3].expression._0_4_ = 1;
  cases_1[3].expression._4_4_ = 1;
  cases_1[3].inType = TYPE_FLOAT_VEC4;
  cases_1[3].minComponents = 1;
  cases_1[3].maxComponents = (int)deFloatExp2(6.7);
  cases_1[3]._32_8_ = anon_var_dwarf_d99bed;
  cases_1[4].name = "log2(${T} (100.0))";
  cases_1[4].expression._0_4_ = 1;
  cases_1[4].expression._4_4_ = 1;
  cases_1[4].inType = TYPE_FLOAT_VEC4;
  cases_1[4].minComponents = 1;
  cases_1[4].maxComponents = (int)deFloatLog2(100.0);
  cases_1[4]._32_8_ = (long)"inversesqrt" + 7;
  cases_1[5].name = "sqrt(${T} (10.0))";
  cases_1[5].expression._0_4_ = 1;
  cases_1[5].expression._4_4_ = 1;
  cases_1[5].inType = TYPE_FLOAT_VEC4;
  cases_1[5].minComponents = 1;
  cases_1[5].maxComponents = (int)::deFloatSqrt(10.0);
  cases_1[5]._32_8_ = anon_var_dwarf_1f5421;
  cases_1[6].name = "inversesqrt(${T} (10.0))";
  cases_1[6].expression._0_4_ = 1;
  cases_1[6].expression._4_4_ = 1;
  cases_1[6].inType = TYPE_FLOAT_VEC4;
  cases_1[6].minComponents = 1;
  cases_1[6].maxComponents = (int)deFloatRsq(10.0);
  addChildGroup(this,"exponential","Exponential",(TestParams *)local_388,7);
  local_868 = (undefined1  [8])0x2a04609;
  cases_2[0].name = "abs(${T} (-42.0))";
  cases_2[0].expression._0_4_ = 1;
  cases_2[0].expression._4_4_ = 1;
  cases_2[0].inType = TYPE_FLOAT_VEC4;
  cases_2[0].minComponents = 1;
  cases_2[0].maxComponents = 0x42280000;
  cases_2[0]._32_8_ = anon_var_dwarf_1f5351;
  cases_2[1].name = "abs(${T} (-42))";
  cases_2[1].expression._0_4_ = 0x1b;
  cases_2[1].expression._4_4_ = 1;
  cases_2[1].inType = TYPE_FLOAT_VEC4;
  cases_2[1].minComponents = 0x1b;
  cases_2[1].maxComponents = 0x42280000;
  cases_2[1]._32_8_ = (long)"invert_sign" + 7;
  cases_2[2].name = "sign(${T} (-18.0))";
  cases_2[2].expression._0_4_ = 1;
  cases_2[2].expression._4_4_ = 1;
  cases_2[2].inType = TYPE_FLOAT_VEC4;
  cases_2[2].minComponents = 1;
  cases_2[2].maxComponents = -0x40800000;
  cases_2[2]._32_8_ = (long)"invert_sign" + 7;
  cases_2[3].name = "sign(${T} (-18))";
  cases_2[3].expression._0_4_ = 0x1b;
  cases_2[3].expression._4_4_ = 1;
  cases_2[3].inType = TYPE_FLOAT_VEC4;
  cases_2[3].minComponents = 0x1b;
  cases_2[3].maxComponents = -0x40800000;
  cases_2[3]._32_8_ = anon_var_dwarf_1f53c6;
  cases_2[4].name = "floor(${T} (37.3))";
  cases_2[4].expression._0_4_ = 1;
  cases_2[4].expression._4_4_ = 1;
  cases_2[4].inType = TYPE_FLOAT_VEC4;
  cases_2[4].minComponents = 1;
  cases_2[4].maxComponents = (int)::deFloatFloor(37.3);
  cases_2[4]._32_8_ = anon_var_dwarf_1f5559;
  cases_2[5].name = "trunc(${T} (-1.8))";
  cases_2[5].expression._0_4_ = 1;
  cases_2[5].expression._4_4_ = 1;
  cases_2[5].inType = TYPE_FLOAT_VEC4;
  cases_2[5].minComponents = 1;
  cases_2[5].maxComponents = -0x40800000;
  cases_2[5]._32_8_ = anon_var_dwarf_1f54fe;
  cases_2[6].name = "round(${T} (42.7))";
  cases_2[6].expression._0_4_ = 1;
  cases_2[6].expression._4_4_ = 1;
  cases_2[6].inType = TYPE_FLOAT_VEC4;
  cases_2[6].minComponents = 1;
  cases_2[6].maxComponents = 0x42280000;
  cases_2[6]._32_8_ = anon_var_dwarf_1f550b;
  cases_2[7].name = "roundEven(${T} (1.5))";
  cases_2[7].expression._0_4_ = 1;
  cases_2[7].expression._4_4_ = 1;
  cases_2[7].inType = TYPE_FLOAT_VEC4;
  cases_2[7].minComponents = 1;
  cases_2[7].maxComponents = 0x40000000;
  cases_2[7]._32_8_ = anon_var_dwarf_1f535e;
  cases_2[8].name = "ceil(${T} (82.2))";
  cases_2[8].expression._0_4_ = 1;
  cases_2[8].expression._4_4_ = 1;
  cases_2[8].inType = TYPE_FLOAT_VEC4;
  cases_2[8].minComponents = 1;
  cases_2[8].maxComponents = (int)::deFloatCeil(82.2);
  cases_2[8]._32_8_ = (long)"refract" + 2;
  cases_2[9].name = "fract(${T} (17.75))";
  cases_2[9].expression._0_4_ = 1;
  cases_2[9].expression._4_4_ = 1;
  cases_2[9].inType = TYPE_FLOAT_VEC4;
  cases_2[9].minComponents = 1;
  cases_2[9].maxComponents = (int)deFloatFrac(17.75);
  cases_2[9]._32_8_ = anon_var_dwarf_1f5496;
  cases_2[10].name = "mod(${T} (87.65), ${MT} (3.7))";
  cases_2[10].expression._0_4_ = 1;
  cases_2[10].expression._4_4_ = 1;
  cases_2[10].inType = TYPE_FLOAT_VEC4;
  cases_2[10].minComponents = 1;
  cases_2[10].maxComponents = (int)deFloatMod(87.65,3.7);
  cases_2[10]._32_8_ = (long)"Max-min" + 4;
  cases_2[0xb].name = "min(${T} (12.3), ${MT} (32.1))";
  cases_2[0xb].expression._0_4_ = 1;
  cases_2[0xb].expression._4_4_ = 1;
  cases_2[0xb].inType = TYPE_FLOAT_VEC4;
  cases_2[0xb].minComponents = 1;
  cases_2[0xb].maxComponents = 0x4144cccd;
  cases_2[0xb]._32_8_ = (long)"Max-min" + 4;
  cases_2[0xc].name = "min(${T} (13), ${MT} (-14))";
  cases_2[0xc].expression._0_4_ = 0x1b;
  cases_2[0xc].expression._4_4_ = 1;
  cases_2[0xc].inType = TYPE_FLOAT_VEC4;
  cases_2[0xc].minComponents = 0x1b;
  cases_2[0xc].maxComponents = -0x3ea00000;
  cases_2[0xc]._32_8_ = (long)"Max-min" + 4;
  cases_2[0xd].name = "min(${T} (13), ${MT} (14))";
  cases_2[0xd].expression._0_4_ = 0x1f;
  cases_2[0xd].expression._4_4_ = 1;
  cases_2[0xd].inType = TYPE_FLOAT_VEC4;
  cases_2[0xd].minComponents = 0x1f;
  cases_2[0xd].maxComponents = 0x41500000;
  cases_2[0xd]._32_8_ =
       (long)
       "uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == max"
       + 0x5d;
  cases_2[0xe].name = "max(${T} (12.3), ${MT} (32.1))";
  cases_2[0xe].expression._0_4_ = 1;
  cases_2[0xe].expression._4_4_ = 1;
  cases_2[0xe].inType = TYPE_FLOAT_VEC4;
  cases_2[0xe].minComponents = 1;
  cases_2[0xe].maxComponents = 0x42006666;
  cases_2[0xe]._32_8_ =
       (long)
       "uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == max"
       + 0x5d;
  cases_2[0xf].name = "max(${T} (13), ${MT} (-14))";
  cases_2[0xf].expression._0_4_ = 0x1b;
  cases_2[0xf].expression._4_4_ = 1;
  cases_2[0xf].inType = TYPE_FLOAT_VEC4;
  cases_2[0xf].minComponents = 0x1b;
  cases_2[0xf].maxComponents = 0x41500000;
  cases_2[0xf]._32_8_ =
       (long)
       "uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == max"
       + 0x5d;
  cases_2[0x10].name = "max(${T} (13), ${MT} (14))";
  cases_2[0x10].expression._0_4_ = 0x1f;
  cases_2[0x10].expression._4_4_ = 1;
  cases_2[0x10].inType = TYPE_FLOAT_VEC4;
  cases_2[0x10].minComponents = 0x1f;
  cases_2[0x10].maxComponents = 0x41600000;
  cases_2[0x10]._32_8_ = (long)"range_clamp" + 6;
  cases_2[0x11].name = "clamp(${T} (42.1),\t${MT} (10.0), ${MT} (15.0))";
  cases_2[0x11].expression._0_4_ = 1;
  cases_2[0x11].expression._4_4_ = 1;
  cases_2[0x11].inType = TYPE_FLOAT_VEC4;
  cases_2[0x11].minComponents = 1;
  cases_2[0x11].maxComponents = 0x41700000;
  cases_2[0x11]._32_8_ = (long)"range_clamp" + 6;
  cases_2[0x12].name = "clamp(${T} (42), ${MT} (-10), ${MT} (15))";
  cases_2[0x12].expression._0_4_ = 0x1b;
  cases_2[0x12].expression._4_4_ = 1;
  cases_2[0x12].inType = TYPE_FLOAT_VEC4;
  cases_2[0x12].minComponents = 0x1b;
  cases_2[0x12].maxComponents = 0x41700000;
  cases_2[0x12]._32_8_ = (long)"range_clamp" + 6;
  cases_2[0x13].name = "clamp(${T} (42), ${MT} (10), ${MT} (15))";
  cases_2[0x13].expression._0_4_ = 0x1f;
  cases_2[0x13].expression._4_4_ = 1;
  cases_2[0x13].inType = TYPE_FLOAT_VEC4;
  cases_2[0x13].minComponents = 0x1f;
  cases_2[0x13].maxComponents = 0x41700000;
  cases_2[0x13]._32_8_ = (long)"uniform-loc-types-mix" + 0x12;
  cases_2[0x14].name = "mix(${T} (10.0), ${T} (20.0), ${MT}(0.75))";
  cases_2[0x14].expression._0_4_ = 1;
  cases_2[0x14].expression._4_4_ = 1;
  cases_2[0x14].inType = TYPE_FLOAT_VEC4;
  cases_2[0x14].minComponents = 1;
  cases_2[0x14].maxComponents = 0x418c0000;
  cases_2[0x14]._32_8_ = anon_var_dwarf_11e9bb2;
  cases_2[0x15].name = "mix(float(10.0), float(20.0), bool(1))";
  cases_2[0x15].expression._0_4_ = 1;
  cases_2[0x15].expression._4_4_ = 1;
  cases_2[0x15].inType = TYPE_FLOAT;
  cases_2[0x15].minComponents = 1;
  cases_2[0x15].maxComponents = 0x41a00000;
  cases_2[0x15]._32_8_ = anon_var_dwarf_11e9bde;
  cases_2[0x16].name = "mix(vec2(10.0), vec2(20.0), bvec2(1)).x";
  cases_2[0x16].expression._0_4_ = 1;
  cases_2[0x16].expression._4_4_ = 1;
  cases_2[0x16].inType = TYPE_FLOAT;
  cases_2[0x16].minComponents = 1;
  cases_2[0x16].maxComponents = 0x41a00000;
  cases_2[0x16]._32_8_ = anon_var_dwarf_11e9bfe;
  cases_2[0x17].name = "mix(vec3(10.0), vec3(20.0), bvec3(1)).x";
  cases_2[0x17].expression._0_4_ = 1;
  cases_2[0x17].expression._4_4_ = 1;
  cases_2[0x17].inType = TYPE_FLOAT;
  cases_2[0x17].minComponents = 1;
  cases_2[0x17].maxComponents = 0x41a00000;
  cases_2[0x17]._32_8_ = anon_var_dwarf_11e9c12;
  cases_2[0x18].name = "mix(vec4(10.0), vec4(20.0), bvec4(1)).x";
  cases_2[0x18].expression._0_4_ = 1;
  cases_2[0x18].expression._4_4_ = 1;
  cases_2[0x18].inType = TYPE_FLOAT;
  cases_2[0x18].minComponents = 1;
  cases_2[0x18].maxComponents = 0x41a00000;
  cases_2[0x18]._32_8_ = (long)"smoothstep" + 6;
  cases_2[0x19].name = "step(${MT} (3.2), ${T} (4.2))";
  cases_2[0x19].expression._0_4_ = 1;
  cases_2[0x19].expression._4_4_ = 1;
  cases_2[0x19].inType = TYPE_FLOAT_VEC4;
  cases_2[0x19].minComponents = 1;
  cases_2[0x19].maxComponents = 0x3f800000;
  cases_2[0x19]._32_8_ = anon_var_dwarf_1f5525;
  cases_2[0x1a].name = "smoothstep(${MT} (3.0), ${MT} (5.0), ${T} (4.0))";
  cases_2[0x1a].expression._0_4_ = 1;
  cases_2[0x1a].expression._4_4_ = 1;
  cases_2[0x1a].inType = TYPE_FLOAT_VEC4;
  cases_2[0x1a].minComponents = 1;
  cases_2[0x1a].maxComponents = 0x3f000000;
  cases_2[0x1a]._32_8_ = anon_var_dwarf_1f5573;
  cases_2[0x1b].name = "isnan(${T} (1.3))";
  cases_2[0x1b].expression._0_4_ = 1;
  cases_2[0x1b].expression._4_4_ = 1;
  cases_2[0x1b].inType = TYPE_FLOAT_VEC4;
  cases_2[0x1b].minComponents = 0x23;
  cases_2[0x1b].maxComponents = 0;
  cases_2[0x1b]._32_8_ = anon_var_dwarf_1f5580;
  cases_2[0x1c].name = "isinf(${T} (1.3))";
  cases_2[0x1c].expression._0_4_ = 1;
  cases_2[0x1c].expression._4_4_ = 1;
  cases_2[0x1c].inType = TYPE_FLOAT_VEC4;
  cases_2[0x1c].minComponents = 0x23;
  cases_2[0x1c].maxComponents = 0;
  cases_2[0x1c]._32_8_ = anon_var_dwarf_11e9c9a;
  cases_2[0x1d].name = "intBitsToFloat(floatBitsToInt(42.12))";
  cases_2[0x1d].expression._0_4_ = 1;
  cases_2[0x1d].expression._4_4_ = 1;
  cases_2[0x1d].inType = TYPE_FLOAT;
  cases_2[0x1d].minComponents = 1;
  cases_2[0x1d].maxComponents = 0x42287ae1;
  cases_2[0x1d]._32_8_ = anon_var_dwarf_11e9cba;
  cases_2[0x1e].name = "uintBitsToFloat(floatBitsToUint(-14.2))";
  cases_2[0x1e].expression._0_4_ = 1;
  cases_2[0x1e].expression._4_4_ = 1;
  cases_2[0x1e].inType = TYPE_FLOAT;
  cases_2[0x1e].minComponents = 1;
  cases_2[0x1e].maxComponents = -0x3e9ccccd;
  addChildGroup(this,"common","Common",(TestParams *)local_868,0x1f);
  memcpy((TestParams *)local_938,&DAT_032996b0,200);
  addChildGroup(this,"float_pack_unpack","Floating point pack & unpack",(TestParams *)local_938,5);
  local_d28 = (undefined1  [8])0x2b77fe2;
  cases_4[0].name = "length(1.0)";
  cases_4[0].expression._0_4_ = 1;
  cases_4[0].expression._4_4_ = 1;
  cases_4[0].inType = TYPE_FLOAT;
  cases_4[0].minComponents = 1;
  cases_4[0].maxComponents = 0x3f800000;
  cases_4[0]._32_8_ = anon_var_dwarf_d99dcd;
  cases_4[1].name = "length(vec2(1.0))";
  cases_4[1].expression._0_4_ = 1;
  cases_4[1].expression._4_4_ = 1;
  cases_4[1].inType = TYPE_FLOAT;
  cases_4[1].minComponents = 1;
  cases_4[1].maxComponents = (int)::deFloatSqrt(2.0);
  cases_4[1]._32_8_ = anon_var_dwarf_d99de1;
  cases_4[2].name = "length(vec3(1.0))";
  cases_4[2].expression._0_4_ = 1;
  cases_4[2].expression._4_4_ = 1;
  cases_4[2].inType = TYPE_FLOAT;
  cases_4[2].minComponents = 1;
  cases_4[2].maxComponents = (int)::deFloatSqrt(3.0);
  cases_4[2]._32_8_ = anon_var_dwarf_d99df5;
  cases_4[3].name = "length(vec4(1.0))";
  cases_4[3].expression._0_4_ = 1;
  cases_4[3].expression._4_4_ = 1;
  cases_4[3].inType = TYPE_FLOAT;
  cases_4[3].minComponents = 1;
  cases_4[3].maxComponents = (int)::deFloatSqrt(4.0);
  cases_4[3]._32_8_ = anon_var_dwarf_d99e09;
  cases_4[4].name = "distance(1.0, 2.0)";
  cases_4[4].expression._0_4_ = 1;
  cases_4[4].expression._4_4_ = 1;
  cases_4[4].inType = TYPE_FLOAT;
  cases_4[4].minComponents = 1;
  cases_4[4].maxComponents = 0x3f800000;
  cases_4[4]._32_8_ = anon_var_dwarf_d99e29;
  cases_4[5].name = "distance(vec2(1.0), vec2(2.0))";
  cases_4[5].expression._0_4_ = 1;
  cases_4[5].expression._4_4_ = 1;
  cases_4[5].inType = TYPE_FLOAT;
  cases_4[5].minComponents = 1;
  cases_4[5].maxComponents = (int)::deFloatSqrt(2.0);
  cases_4[5]._32_8_ = anon_var_dwarf_d99e3d;
  cases_4[6].name = "distance(vec3(1.0), vec3(2.0))";
  cases_4[6].expression._0_4_ = 1;
  cases_4[6].expression._4_4_ = 1;
  cases_4[6].inType = TYPE_FLOAT;
  cases_4[6].minComponents = 1;
  cases_4[6].maxComponents = (int)::deFloatSqrt(3.0);
  cases_4[6]._32_8_ = anon_var_dwarf_d99e51;
  cases_4[7].name = "distance(vec4(1.0), vec4(2.0))";
  cases_4[7].expression._0_4_ = 1;
  cases_4[7].expression._4_4_ = 1;
  cases_4[7].inType = TYPE_FLOAT;
  cases_4[7].minComponents = 1;
  cases_4[7].maxComponents = (int)::deFloatSqrt(4.0);
  cases_4[7]._32_8_ = anon_var_dwarf_d99e65;
  cases_4[8].name = "dot(1.0, 1.0)";
  cases_4[8].expression._0_4_ = 1;
  cases_4[8].expression._4_4_ = 1;
  cases_4[8].inType = TYPE_FLOAT;
  cases_4[8].minComponents = 1;
  cases_4[8].maxComponents = 0x3f800000;
  cases_4[8]._32_8_ = anon_var_dwarf_d99e85;
  cases_4[9].name = "dot(vec2(1.0), vec2(1.0))";
  cases_4[9].expression._0_4_ = 1;
  cases_4[9].expression._4_4_ = 1;
  cases_4[9].inType = TYPE_FLOAT;
  cases_4[9].minComponents = 1;
  cases_4[9].maxComponents = 0x40000000;
  cases_4[9]._32_8_ = anon_var_dwarf_d99eb1;
  cases_4[10].name = "dot(vec3(1.0), vec3(1.0))";
  cases_4[10].expression._0_4_ = 1;
  cases_4[10].expression._4_4_ = 1;
  cases_4[10].inType = TYPE_FLOAT;
  cases_4[10].minComponents = 1;
  cases_4[10].maxComponents = 0x40400000;
  cases_4[10]._32_8_ = anon_var_dwarf_d99ec5;
  cases_4[0xb].name = "dot(vec4(1.0), vec4(1.0))";
  cases_4[0xb].expression._0_4_ = 1;
  cases_4[0xb].expression._4_4_ = 1;
  cases_4[0xb].inType = TYPE_FLOAT;
  cases_4[0xb].minComponents = 1;
  cases_4[0xb].maxComponents = 0x40800000;
  cases_4[0xb]._32_8_ = anon_var_dwarf_d99ed9;
  cases_4[0xc].name = "normalize(1.0)";
  cases_4[0xc].expression._0_4_ = 1;
  cases_4[0xc].expression._4_4_ = 1;
  cases_4[0xc].inType = TYPE_FLOAT;
  cases_4[0xc].minComponents = 1;
  cases_4[0xc].maxComponents = 0x3f800000;
  cases_4[0xc]._32_8_ = anon_var_dwarf_d99eed;
  cases_4[0xd].name = "normalize(vec2(1.0)).x";
  cases_4[0xd].expression._0_4_ = 1;
  cases_4[0xd].expression._4_4_ = 1;
  cases_4[0xd].inType = TYPE_FLOAT;
  cases_4[0xd].minComponents = 1;
  cases_4[0xd].maxComponents = (int)deFloatRsq(2.0);
  cases_4[0xd]._32_8_ = anon_var_dwarf_d99f0d;
  cases_4[0xe].name = "normalize(vec3(1.0)).x";
  cases_4[0xe].expression._0_4_ = 1;
  cases_4[0xe].expression._4_4_ = 1;
  cases_4[0xe].inType = TYPE_FLOAT;
  cases_4[0xe].minComponents = 1;
  cases_4[0xe].maxComponents = (int)deFloatRsq(3.0);
  cases_4[0xe]._32_8_ = anon_var_dwarf_d99f21;
  cases_4[0xf].name = "normalize(vec4(1.0)).x";
  cases_4[0xf].expression._0_4_ = 1;
  cases_4[0xf].expression._4_4_ = 1;
  cases_4[0xf].inType = TYPE_FLOAT;
  cases_4[0xf].minComponents = 1;
  cases_4[0xf].maxComponents = (int)deFloatRsq(4.0);
  cases_4[0xf]._32_8_ = anon_var_dwarf_1f53b9;
  cases_4[0x10].name = "faceforward(${T} (1.0), ${T} (1.0), ${T} (1.0))";
  cases_4[0x10].expression._0_4_ = 1;
  cases_4[0x10].expression._4_4_ = 1;
  cases_4[0x10].inType = TYPE_FLOAT_VEC4;
  cases_4[0x10].minComponents = 1;
  cases_4[0x10].maxComponents = -0x40800000;
  cases_4[0x10]._32_8_ = anon_var_dwarf_d99f55;
  cases_4[0x11].name = "reflect(1.0, 1.0)";
  cases_4[0x11].expression._0_4_ = 1;
  cases_4[0x11].expression._4_4_ = 1;
  cases_4[0x11].inType = TYPE_FLOAT;
  cases_4[0x11].minComponents = 1;
  cases_4[0x11].maxComponents = -0x40800000;
  cases_4[0x11]._32_8_ = anon_var_dwarf_d99f69;
  cases_4[0x12].name = "reflect(vec2(1.0), vec2(1.0, 0.0)).x";
  cases_4[0x12].expression._0_4_ = 1;
  cases_4[0x12].expression._4_4_ = 1;
  cases_4[0x12].inType = TYPE_FLOAT;
  cases_4[0x12].minComponents = 1;
  cases_4[0x12].maxComponents = -0x40800000;
  cases_4[0x12]._32_8_ = anon_var_dwarf_d99f89;
  cases_4[0x13].name = "reflect(vec3(1.0), vec3(1.0, 0.0, 0.0)).x";
  cases_4[0x13].expression._0_4_ = 1;
  cases_4[0x13].expression._4_4_ = 1;
  cases_4[0x13].inType = TYPE_FLOAT;
  cases_4[0x13].minComponents = 1;
  cases_4[0x13].maxComponents = -0x40800000;
  cases_4[0x13]._32_8_ = anon_var_dwarf_d99fa9;
  cases_4[0x14].name = "reflect(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0)).x";
  cases_4[0x14].expression._0_4_ = 1;
  cases_4[0x14].expression._4_4_ = 1;
  cases_4[0x14].inType = TYPE_FLOAT;
  cases_4[0x14].minComponents = 1;
  cases_4[0x14].maxComponents = -0x40800000;
  cases_4[0x14]._32_8_ = anon_var_dwarf_d99fbd;
  cases_4[0x15].name = "refract(1.0, 1.0, 0.5)";
  cases_4[0x15].expression._0_4_ = 1;
  cases_4[0x15].expression._4_4_ = 1;
  cases_4[0x15].inType = TYPE_FLOAT;
  cases_4[0x15].minComponents = 1;
  cases_4[0x15].maxComponents = -0x40800000;
  cases_4[0x15]._32_8_ = anon_var_dwarf_d99fd1;
  cases_4[0x16].name = "refract(vec2(1.0), vec2(1.0, 0.0), 0.5).x";
  cases_4[0x16].expression._0_4_ = 1;
  cases_4[0x16].expression._4_4_ = 1;
  cases_4[0x16].inType = TYPE_FLOAT;
  cases_4[0x16].minComponents = 1;
  cases_4[0x16].maxComponents = -0x40800000;
  cases_4[0x16]._32_8_ = anon_var_dwarf_d99fe5;
  cases_4[0x17].name = "refract(vec3(1.0), vec3(1.0, 0.0, 0.0), 0.5).x";
  cases_4[0x17].expression._0_4_ = 1;
  cases_4[0x17].expression._4_4_ = 1;
  cases_4[0x17].inType = TYPE_FLOAT;
  cases_4[0x17].minComponents = 1;
  cases_4[0x17].maxComponents = -0x40800000;
  cases_4[0x17]._32_8_ = anon_var_dwarf_d99ff9;
  cases_4[0x18].name = "refract(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0), 0.5).x";
  cases_4[0x18].expression._0_4_ = 1;
  cases_4[0x18].expression._4_4_ = 1;
  cases_4[0x18].inType = TYPE_FLOAT;
  cases_4[0x18].minComponents = 1;
  cases_4[0x18].maxComponents = -0x40800000;
  addChildGroup(this,"geometric","Geometric",(TestParams *)local_d28,0x19);
  memcpy((TestParams *)local_1168,&PTR_anon_var_dwarf_d9a02d_03299780,0x438);
  addChildGroup(this,"matrix","Matrix",(TestParams *)local_1168,0x1b);
  memcpy((TestParams *)local_15a8,&PTR_anon_var_dwarf_1f543b_03299bc0,0x438);
  addChildGroup(this,"vector_relational","Vector relational",(TestParams *)local_15a8,0x1b);
  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_11ea477;
  testContext = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  renderContext = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  contextInfo = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderConstExpr::createTests
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&group,testContext,
             renderContext,contextInfo,
             (TestParams *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,3,GLSL_VERSION_300_ES,SHADER_FRAGMENT);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "fragment_processing","Fragment processing");
  tcu::TestNode::addChild((TestNode *)this,node);
  local_1658 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                      ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&group);
    if ((int)sVar1 <= local_1658) break;
    ppTVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&group,
                         (long)local_1658);
    tcu::TestNode::addChild(node,*ppTVar2);
    local_1658 = local_1658 + 1;
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&group);
  return extraout_EAX;
}

Assistant:

void ShaderConstExprBuiltinTests::init (void)
{
	using namespace gls::ShaderConstExpr;

	// ${T} => final type, ${MT} => final type but with scalar version usable even when T is a vector

	// Trigonometry
	{
		const TestParams cases[] =
		{
			{"radians",			"radians(${T} (90.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatRadians(90.0f)		},
			{"degrees",			"degrees(${T} (2.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatDegrees(2.0f)		},
			{"sin",				"sin(${T} (3.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSin(3.0f)			},
			{"cos",				"cos(${T} (3.2))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCos(3.2f)			},
			{"tan",				"tan(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatTan(1.5f)			},
			{"asin",			"asin(${T} (0.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAsin(0.0f)			},
			{"acos",			"acos(${T} (1.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAcos(1.0f)			},
			{"atan_separate",	"atan(${T} (-1.0), ${T} (-1.0))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtan2(-1.0f, -1.0f)	},
			{"atan_combined",	"atan(${T} (2.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtanOver(2.0f)		},
			{"sinh",			"sinh(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSinh(1.5f)			},
			{"cosh",			"cosh(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCosh(1.5f)			},
			{"tanh",			"tanh(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatTanh(1.5f)			},
			{"asinh",			"asinh(${T} (2.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAsinh(2.0f)			},
			{"acosh",			"acosh(${T} (2.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAcosh(2.0f)			},
			{"atanh",			"atanh(${T} (0.8))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtanh(0.8f)			},
		};

		addChildGroup("angle_and_trigonometry", "Angles and Trigonometry", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Exponential
	{
		const TestParams cases[] =
		{
			{"pow",				"pow(${T} (1.7), ${T} (3.5))",							glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatPow(1.7f, 3.5f)		},
			{"exp",				"exp(${T} (4.2))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatExp(4.2f)			},
			{"log",				"log(${T} (42.12))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatLog(42.12f)			},
			{"exp2",			"exp2(${T} (6.7))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatExp2(6.7f)			},
			{"log2",			"log2(${T} (100.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatLog2(100.0f)			},
			{"sqrt",			"sqrt(${T} (10.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSqrt(10.0f)			},
			{"inversesqrt",		"inversesqrt(${T} (10.0))",								glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatRsq(10.0f)			},
		};

		addChildGroup("exponential", "Exponential", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Common
	{
		const TestParams cases[] =
		{
			{"abs",				"abs(${T} (-42.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 42.0f						},
			{"abs",				"abs(${T} (-42))",										glu::TYPE_INT,   1, 4, glu::TYPE_INT,   42.0f						},
			{"sign",			"sign(${T} (-18.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},
			{"sign",			"sign(${T} (-18))",										glu::TYPE_INT,   1, 4, glu::TYPE_INT,	-1.0f						},
			{"floor",			"floor(${T} (37.3))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatFloor(37.3f)			},
			{"trunc",			"trunc(${T} (-1.8))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},
			{"round",			"round(${T} (42.7))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 42.0f						},
			{"roundEven",		"roundEven(${T} (1.5))",								glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT,  2.0f						},
			{"ceil",			"ceil(${T} (82.2))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCeil(82.2f)			},
			{"fract",			"fract(${T} (17.75))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatFrac(17.75f)			},
			{"mod",				"mod(${T} (87.65), ${MT} (3.7))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatMod(87.65f, 3.7f)	},
			// modf cannot be tested due to lacking valid ways of using the 'out' parameter in a constant expression
			{"min",				"min(${T} (12.3), ${MT} (32.1))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 12.3f						},
			{"min",				"min(${T} (13), ${MT} (-14))",							glu::TYPE_INT,   1, 4, glu::TYPE_INT,  -14.0f						},
			{"min",				"min(${T} (13), ${MT} (14))",							glu::TYPE_UINT,  1, 4, glu::TYPE_UINT,	13.0f						},
			{"max",				"max(${T} (12.3), ${MT} (32.1))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 32.1f						},
			{"max",				"max(${T} (13), ${MT} (-14))",							glu::TYPE_INT,   1, 4, glu::TYPE_INT,	13.0f						},
			{"max",				"max(${T} (13), ${MT} (14))",							glu::TYPE_UINT,  1, 4, glu::TYPE_UINT,	14.0f						},
			{"clamp",			"clamp(${T} (42.1),	${MT} (10.0), ${MT} (15.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 15.0f						},
			{"clamp",			"clamp(${T} (42), ${MT} (-10), ${MT} (15))",			glu::TYPE_INT,   1, 4, glu::TYPE_INT,	15.0f						},
			{"clamp",			"clamp(${T} (42), ${MT} (10), ${MT} (15))",				glu::TYPE_UINT,  1, 4, glu::TYPE_UINT,	15.0f						},

			{"mix",				"mix(${T} (10.0), ${T} (20.0), ${MT}(0.75))",			glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 17.5f						},
			{"mix_float_bool",	"mix(float(10.0), float(20.0), bool(1))",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 20.0f						},
			{"mix_vec2_bvec2",	"mix(vec2(10.0), vec2(20.0), bvec2(1)).x",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 20.0f						},
			{"mix_vec3_bvec3",	"mix(vec3(10.0), vec3(20.0), bvec3(1)).x",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 20.0f						},
			{"mix_vec4_bvec4",	"mix(vec4(10.0), vec4(20.0), bvec4(1)).x",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 20.0f						},

			{"step",			"step(${MT} (3.2), ${T} (4.2))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 1.0f						},
			{"smoothstep",		"smoothstep(${MT} (3.0), ${MT} (5.0), ${T} (4.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.5f						},
			{"isnan",			"isnan(${T} (1.3))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_BOOL,  0.0f						},
			{"isinf",			"isinf(${T} (1.3))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_BOOL,  0.0f						},
			{"floatbits_int",	"intBitsToFloat(floatBitsToInt(42.12))",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 42.12f						},
			{"floatbits_uint",	"uintBitsToFloat(floatBitsToUint(-14.2))",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -14.2f						},
		};

		addChildGroup("common", "Common", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Floating point pack & unpack
	{
		const TestParams cases[] =
		{
			{"packSnorm2x16",	"packSnorm2x16(vec2(0.7, 0.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_UINT,  22937.0f					},
			{"unpackSnorm2x16",	"unpackSnorm2x16(22937u).x",							glu::TYPE_UINT,  1, 1, glu::TYPE_FLOAT, 0.7f						},
			{"packUnorm2x16",	"packUnorm2x16(vec2(0.6, -0.3))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_UINT,	39321.0f					},
			{"unpackUnorm2x16",	"unpackUnorm2x16(39321u).x",							glu::TYPE_UINT,  1, 1, glu::TYPE_FLOAT, 0.6f						},
			{"packHalf2x16",	"unpackHalf2x16(packHalf2x16(vec2(0.3, 0.1))).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 0.3f						},
			// \todo [2014-01-29 otto] Separate testing of half-precision pack & unpack
		};

		addChildGroup("float_pack_unpack", "Floating point pack & unpack", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Geometric
	{
		const TestParams cases[] =
		{
			{"length_float",	"length(1.0)",											glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"length_vec2",		"length(vec2(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(2.0f)			},
			{"length_vec3",		"length(vec3(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(3.0f)			},
			{"length_vec4",		"length(vec4(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(4.0f)			},

			{"distance_float",	"distance(1.0, 2.0)",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"distance_vec2",	"distance(vec2(1.0), vec2(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(2.0f)			},
			{"distance_vec3",	"distance(vec3(1.0), vec3(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(3.0f)			},
			{"distance_vec4",	"distance(vec4(1.0), vec4(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(4.0f)			},

			{"dot_float",		"dot(1.0, 1.0)",										glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"dot_vec2",		"dot(vec2(1.0), vec2(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"dot_vec3",		"dot(vec3(1.0), vec3(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 3.0f						},
			{"dot_vec4",		"dot(vec4(1.0), vec4(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 4.0f						},

			{"normalize_float",	"normalize(1.0)",										glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"normalize_vec2",	"normalize(vec2(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(2.0f)			},
			{"normalize_vec3",	"normalize(vec3(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(3.0f)			},
			{"normalize_vec4",	"normalize(vec4(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(4.0f)			},

			{"faceforward",		"faceforward(${T} (1.0), ${T} (1.0), ${T} (1.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},

			// reflect(I, N) => I - 2*dot(N, I)*N
			{"reflect_float",	"reflect(1.0, 1.0)",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec2",	"reflect(vec2(1.0), vec2(1.0, 0.0)).x",					glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec3",	"reflect(vec3(1.0), vec3(1.0, 0.0, 0.0)).x",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec4",	"reflect(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0)).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},

			/*
			genType refract(genType I, genType N, float eta) =>
				k = 1.0 - (eta^2)*(1.0-dot(N,I)^2)
				if k < 0 return 0.0
				else return eta*I - (eta*dot(N,I) + sqrt(k))*N
			*/
			{"refract_float",	"refract(1.0, 1.0, 0.5)",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec2",	"refract(vec2(1.0), vec2(1.0, 0.0), 0.5).x",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec3",	"refract(vec3(1.0), vec3(1.0, 0.0, 0.0), 0.5).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec4",	"refract(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0), 0.5).x",	glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
		};

		addChildGroup("geometric", "Geometric", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Matrix
	{
		const TestParams cases[] =
		{
			{"compMult_mat2",	"matrixCompMult(mat2(1.0), mat2(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"compMult_mat3",	"matrixCompMult(mat3(1.0), mat3(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"compMult_mat4",	"matrixCompMult(mat4(1.0), mat4(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"outerProd_mat2",	"outerProduct(vec2(3.0), vec2(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat3",	"outerProduct(vec3(3.0), vec3(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat4",	"outerProduct(vec4(3.0), vec4(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},

			{"outerProd_mat2x3","outerProduct(vec3(3.0), vec2(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat3x2","outerProduct(vec2(3.0), vec3(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat2x4","outerProduct(vec4(3.0), vec2(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat4x2","outerProduct(vec2(3.0), vec4(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat3x4","outerProduct(vec4(3.0), vec3(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},
			{"outerProd_mat4x3","outerProduct(vec3(3.0), vec4(3.0))[0][0]",				glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 9.0f						},

			{"transpose_mat2",	"transpose(mat2(2.0))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"transpose_mat3",	"transpose(mat3(2.0))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"transpose_mat4",	"transpose(mat4(2.0))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"transpose_mat3x2","transpose(mat3x2(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat2x3","transpose(mat2x3(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat4x2","transpose(mat4x2(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat4x3","transpose(mat4x3(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat2x4","transpose(mat2x4(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},
			{"transpose_mat3x4","transpose(mat3x4(2.3))[0][0]",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.3f						},

			{"determinant_mat2","determinant(mat2(2.0))",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 4.0f						},
			{"determinant_mat3","determinant(mat3(2.0))",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 8.0f						},
			{"determinant_mat4","determinant(mat4(2.0))",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 16.0f						},

			{"inverse_mat2",	"inverse(mat2(2.0))[0][0]",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 0.5f						},
			{"inverse_mat3",	"inverse(mat3(2.0))[0][0]",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 0.5f						},
			{"inverse_mat4",	"inverse(mat4(2.0))[0][0]",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 0.5f						},
		};

		addChildGroup("matrix", "Matrix", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Vector relational
	{
		const TestParams cases[] =
		{
			{"lessThan",		"lessThan(${T} (1.0), ${T} (2.0))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThan",		"lessThan(${T} (-1), ${T} (2))",						glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThan",		"lessThan(${T} (1), ${T} (2))",							glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (1.0), ${T} (1.0))",				glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (-1), ${T} (-1))",					glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (1), ${T} (1))",					glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"greaterThan",		"greaterThan(${T} (1.0), ${T} (2.0))",					glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThan",		"greaterThan(${T} (-1), ${T} (2))",						glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThan",		"greaterThan(${T} (1), ${T} (2))",						glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (1.0), ${T} (2.0))",				glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (-1), ${T} (2))",				glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (1), ${T} (2))",					glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1.0), ${T} (1.2))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1), ${T} (-2))",							glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1), ${T} (2))",							glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (true), ${T} (false))",						glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"notEqual",		"notEqual(${T} (1.0), ${T} (1.2))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (1), ${T} (-2))",						glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (1), ${T} (2))",							glu::TYPE_UINT,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (true), ${T} (false))",					glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec2",		"any(bvec2(true, false))",								glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec3",		"any(bvec3(true, false, false))",						glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec4",		"any(bvec4(true, false, false, false))",				glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"all_bvec2",		"all(bvec2(true, false))",								glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"all_bvec3",		"all(bvec3(true, false, false))",						glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"all_bvec4",		"all(bvec4(true, false, false, false))",				glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"not",				"not(${T} (false))",									glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  1.0f						},
		};

		addChildGroup("vector_relational", "Vector relational", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Fragment processing (must return zero when used in initilizer with constexpr arguement)
	{
		const TestParams cases[] =
		{
			{"dFdx",			"dFdx(${T} (123.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.0							},
			{"dFdy",			"dFdx(${T} (234.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.0							},
			{"fwidth",			"fwidth(${T} (345.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.0							},
		};

		const std::vector<tcu::TestNode*>	children = createTests(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), cases, DE_LENGTH_OF_ARRAY(cases), glu::GLSL_VERSION_300_ES, SHADER_FRAGMENT);
		tcu::TestCaseGroup*					group	 = new tcu::TestCaseGroup(m_testCtx, "fragment_processing", "Fragment processing");

		addChild(group);

		for (int i = 0; i < (int)children.size(); i++)
			group->addChild(children[i]);
	}
}